

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
* anon_unknown.dwarf_ea566c::ParsePubkey
            (vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
             *__return_storage_ptr__,uint32_t key_exp_index,Span<const_char> *sp,
            ParseScriptContext ctx,FlatSigningProvider *out,string *error)

{
  pointer __last;
  bool bVar1;
  char cVar2;
  reference __x;
  OriginPubkeyProvider *this;
  _Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  *this_00;
  _Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  *__result;
  pointer puVar3;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  *pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  _Tp_alloc_type *__alloc;
  char *__s;
  size_t __n;
  ulong __n_00;
  pointer puVar5;
  pointer __p;
  long in_FS_OFFSET;
  string_view hex_str;
  string_view str;
  _Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  *local_170;
  _Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false> local_148;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  providers;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  path;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fpr_bytes;
  vector<Span<const_char>,_std::allocator<Span<const_char>_>_> slash_split;
  bool apostrophe;
  vector<Span<const_char>,_std::allocator<Span<const_char>_>_> origin_split;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  local_b8;
  PubkeyProvider *local_a0;
  KeyOriginInfo info;
  string fpr_hex;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  util::Split<Span<char_const>>(&origin_split,(util *)sp,(Span<const_char> *)0x5d,(char)ctx);
  if ((ulong)((long)origin_split.
                    super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl
                    .super__Vector_impl_data._M_finish -
             (long)origin_split.
                   super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
                   super__Vector_impl_data._M_start) < 0x21) {
    apostrophe = false;
    if ((long)origin_split.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)origin_split.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
              _M_impl.super__Vector_impl_data._M_start == 0x10) {
      ParsePubkeyInner(__return_storage_ptr__,key_exp_index,
                       origin_split.
                       super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                       _M_impl.super__Vector_impl_data._M_start,ctx,out,&apostrophe,error);
      goto LAB_0030a2fc;
    }
    if ((origin_split.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
         _M_impl.super__Vector_impl_data._M_start)->m_size == 0) {
      cVar2 = ']';
    }
    else {
      if (*(origin_split.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
            _M_impl.super__Vector_impl_data._M_start)->m_data == '[') {
        local_58._0_8_ =
             (origin_split.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
              _M_impl.super__Vector_impl_data._M_start)->m_data + 1;
        local_58._8_8_ =
             (origin_split.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
              _M_impl.super__Vector_impl_data._M_start)->m_size - 1;
        util::Split<Span<char_const>>
                  (&slash_split,(util *)local_58,(Span<const_char> *)0x2f,(char)local_58._0_8_);
        args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (slash_split.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->m_size;
        if (args == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8) {
          fpr_hex._M_dataplus._M_p = (pointer)&fpr_hex.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&fpr_hex,
                     (slash_split.
                      super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                      _M_impl.super__Vector_impl_data._M_start)->m_data,
                     (slash_split.
                      super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                      _M_impl.super__Vector_impl_data._M_start)->m_data + 8);
          str._M_str = fpr_hex._M_dataplus._M_p;
          str._M_len = fpr_hex._M_string_length;
          bVar1 = IsHex(str);
          if (bVar1) {
            hex_str._M_str = fpr_hex._M_dataplus._M_p;
            hex_str._M_len = fpr_hex._M_string_length;
            ParseHex<unsigned_char>(&fpr_bytes,hex_str);
            info.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            info.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            info.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if ((long)fpr_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)fpr_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start != 4) {
              __assert_fail("fpr_bytes.size() == 4",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/descriptor.cpp"
                            ,0x653,
                            "std::vector<std::unique_ptr<PubkeyProvider>> (anonymous namespace)::ParsePubkey(uint32_t, const Span<const char> &, ParseScriptContext, FlatSigningProvider &, std::string &)"
                           );
            }
            if (fpr_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                fpr_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start) {
              info.fingerprint =
                   *(uchar (*) [4])
                    fpr_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
            }
            path.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            path.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            path.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            bVar1 = ParseKeyPath(&slash_split,&path,&apostrophe,error,false);
            if (bVar1) {
              __x = std::
                    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ::at(&path,0);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&info.path,__x);
              ParsePubkeyInner(&providers,key_exp_index,
                               origin_split.
                               super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 1,ctx,out,&apostrophe,
                               error);
              pvVar4 = __return_storage_ptr__;
              if (providers.
                  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  providers.
                  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                std::
                vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                ::reserve(&local_b8,
                          (long)providers.
                                super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)providers.
                                super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3);
                local_170 = (_Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                             *)local_b8.
                               super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                bVar1 = (bool)(apostrophe & 1);
                for (puVar5 = providers.
                              super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    __n_00 = (ulong)key_exp_index,
                    puVar5 != providers.
                              super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish; puVar5 = puVar5 + 1) {
                  this = (OriginPubkeyProvider *)operator_new(0x40);
                  KeyOriginInfo::KeyOriginInfo((KeyOriginInfo *)local_58,&info);
                  local_a0 = (puVar5->_M_t).
                             super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                             .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>.
                             _M_head_impl;
                  (puVar5->_M_t).
                  super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>.
                  _M_head_impl = (PubkeyProvider *)0x0;
                  __alloc = (_Tp_alloc_type *)&local_a0;
                  OriginPubkeyProvider::OriginPubkeyProvider
                            (this,key_exp_index,(KeyOriginInfo *)local_58,
                             (unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                              *)__alloc,bVar1);
                  local_148._M_head_impl = (PubkeyProvider *)this;
                  if (local_a0 != (PubkeyProvider *)0x0) {
                    (*local_a0->_vptr_PubkeyProvider[1])();
                  }
                  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                             (local_58 + 8));
                  __last = local_b8.
                           super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  if (local_b8.
                      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish ==
                      local_b8.
                      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    this_00 = (_Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                               *)std::
                                 vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                                 ::_M_check_len(&local_b8,__n_00,__s);
                    __result = (_Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                                *)std::
                                  _Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                                  ::_M_allocate(this_00,__n_00);
                    local_148._M_head_impl = (PubkeyProvider *)0x0;
                    *(OriginPubkeyProvider **)((long)__result + ((long)__last - (long)local_170)) =
                         this;
                    puVar3 = std::
                             vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                             ::_S_relocate((pointer)local_170,__last,(pointer)__result,__alloc);
                    puVar3 = std::
                             vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                             ::_S_relocate(__last,__last,puVar3 + 1,__alloc);
                    std::
                    _Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                    ::_M_deallocate(local_170,(pointer)((long)__last - (long)local_170 >> 3),__n);
                    local_b8.
                    super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)((tuple<(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                                    *)&(__result->_M_impl).super__Vector_impl_data._M_start +
                                  (long)this_00);
                    local_170 = __result;
                    local_b8.
                    super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)__result;
                  }
                  else {
                    local_148._M_head_impl = (PubkeyProvider *)0x0;
                    ((local_b8.
                      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->_M_t).
                    super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>.
                    _M_head_impl = (PubkeyProvider *)this;
                    puVar3 = local_b8.
                             super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 1;
                  }
                  local_b8.
                  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = puVar3;
                  std::
                  unique_ptr<(anonymous_namespace)::OriginPubkeyProvider,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
                  ::~unique_ptr((unique_ptr<(anonymous_namespace)::OriginPubkeyProvider,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
                                 *)&local_148);
                }
                (__return_storage_ptr__->
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start = (pointer)local_170;
                (__return_storage_ptr__->
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish =
                     local_b8.
                     super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                (__return_storage_ptr__->
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage =
                     local_b8.
                     super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                pvVar4 = &local_b8;
              }
              (pvVar4->
              super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (pvVar4->
              super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              (pvVar4->
              super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::
              vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
              ::~vector(&providers);
            }
            else {
              (__return_storage_ptr__->
              super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (__return_storage_ptr__->
              super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              (__return_storage_ptr__->
              super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            }
            std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::~vector(&path);
            std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      (&info.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&fpr_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
            ;
          }
          else {
            tinyformat::format<std::__cxx11::string>
                      ((string *)local_58,(tinyformat *)"Fingerprint \'%s\' is not hex",
                       (char *)&fpr_hex,args);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_58);
            std::__cxx11::string::~string((string *)local_58);
            (__return_storage_ptr__->
            super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (__return_storage_ptr__->
            super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (__return_storage_ptr__->
            super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          }
          std::__cxx11::string::~string((string *)&fpr_hex);
        }
        else {
          fpr_hex._M_dataplus._M_p = (pointer)args;
          tinyformat::format<unsigned_long>
                    ((string *)local_58,
                     "Fingerprint is not 4 bytes (%u characters instead of 8 characters)",
                     (unsigned_long *)&fpr_hex);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_58);
          std::__cxx11::string::~string((string *)local_58);
          (__return_storage_ptr__->
          super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->
          super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->
          super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        }
        std::_Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>::~_Vector_base
                  (&slash_split.
                    super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>);
        goto LAB_0030a2fc;
      }
      cVar2 = *(origin_split.
                super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
                super__Vector_impl_data._M_start)->m_data;
    }
    fpr_hex._M_dataplus._M_p._0_1_ = cVar2;
    tinyformat::format<char>
              ((string *)local_58,
               "Key origin start \'[ character expected but not found, got \'%c\' instead",
               (char *)&fpr_hex);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
    std::__cxx11::string::~string((string *)local_58);
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (error,"Multiple \']\' characters found for a single pubkey");
  }
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_0030a2fc:
  std::_Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>::~_Vector_base
            (&origin_split.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>)
  ;
  std::
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ::~vector(&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<std::unique_ptr<PubkeyProvider>> ParsePubkey(uint32_t key_exp_index, const Span<const char>& sp, ParseScriptContext ctx, FlatSigningProvider& out, std::string& error)
{
    std::vector<std::unique_ptr<PubkeyProvider>> ret;
    auto origin_split = Split(sp, ']');
    if (origin_split.size() > 2) {
        error = "Multiple ']' characters found for a single pubkey";
        return {};
    }
    // This is set if either the origin or path suffix contains a hardened derivation.
    bool apostrophe = false;
    if (origin_split.size() == 1) {
        return ParsePubkeyInner(key_exp_index, origin_split[0], ctx, out, apostrophe, error);
    }
    if (origin_split[0].empty() || origin_split[0][0] != '[') {
        error = strprintf("Key origin start '[ character expected but not found, got '%c' instead",
                          origin_split[0].empty() ? /** empty, implies split char */ ']' : origin_split[0][0]);
        return {};
    }
    auto slash_split = Split(origin_split[0].subspan(1), '/');
    if (slash_split[0].size() != 8) {
        error = strprintf("Fingerprint is not 4 bytes (%u characters instead of 8 characters)", slash_split[0].size());
        return {};
    }
    std::string fpr_hex = std::string(slash_split[0].begin(), slash_split[0].end());
    if (!IsHex(fpr_hex)) {
        error = strprintf("Fingerprint '%s' is not hex", fpr_hex);
        return {};
    }
    auto fpr_bytes = ParseHex(fpr_hex);
    KeyOriginInfo info;
    static_assert(sizeof(info.fingerprint) == 4, "Fingerprint must be 4 bytes");
    assert(fpr_bytes.size() == 4);
    std::copy(fpr_bytes.begin(), fpr_bytes.end(), info.fingerprint);
    std::vector<KeyPath> path;
    if (!ParseKeyPath(slash_split, path, apostrophe, error, /*allow_multipath=*/false)) return {};
    info.path = path.at(0);
    auto providers = ParsePubkeyInner(key_exp_index, origin_split[1], ctx, out, apostrophe, error);
    if (providers.empty()) return {};
    ret.reserve(providers.size());
    for (auto& prov : providers) {
        ret.emplace_back(std::make_unique<OriginPubkeyProvider>(key_exp_index, info, std::move(prov), apostrophe));
    }
    return ret;
}